

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedate.c
# Opt level: O0

int oneortwodigit(char *date,char **endp)

{
  int num;
  char **endp_local;
  char *date_local;
  
  date_local._4_4_ = *date + -0x30;
  if ((date[1] < '0') || ('9' < date[1])) {
    *endp = date + 1;
  }
  else {
    *endp = date + 2;
    date_local._4_4_ = date_local._4_4_ * 10 + date[1] + -0x30;
  }
  return date_local._4_4_;
}

Assistant:

static int oneortwodigit(const char *date, const char **endp)
{
  int num = date[0] - '0';
  if(ISDIGIT(date[1])) {
    *endp = &date[2];
    return num*10 + (date[1] - '0');
  }
  *endp = &date[1];
  return num;
}